

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O1

int easm_isimm(easm_expr *expr)

{
  easm_expr_type eVar1;
  int iVar2;
  
  while( true ) {
    for (; eVar1 = expr->type, eVar1 - EASM_EXPR_LOR < 0xc; expr = expr->e2) {
      iVar2 = easm_isimm(expr->e1);
      if (iVar2 == 0) goto LAB_00269813;
    }
    if (2 < eVar1 - EASM_EXPR_NEG) break;
    expr = expr->e1;
  }
  iVar2 = 1;
  if ((eVar1 != EASM_EXPR_NUM) && (eVar1 != EASM_EXPR_LABEL)) {
LAB_00269813:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int easm_isimm(struct easm_expr *expr) {
	switch (expr->type) {
		case EASM_EXPR_LOR:
		case EASM_EXPR_LAND:
		case EASM_EXPR_OR:
		case EASM_EXPR_XOR:
		case EASM_EXPR_AND:
		case EASM_EXPR_SHL:
		case EASM_EXPR_SHR:
		case EASM_EXPR_ADD:
		case EASM_EXPR_SUB:
		case EASM_EXPR_MUL:
		case EASM_EXPR_DIV:
		case EASM_EXPR_MOD:
			return easm_isimm(expr->e1) && easm_isimm(expr->e2);
		case EASM_EXPR_NEG:
		case EASM_EXPR_NOT:
		case EASM_EXPR_LNOT:
			return easm_isimm(expr->e1);
		case EASM_EXPR_NUM:
		case EASM_EXPR_LABEL:
			return 1;
		default:
			return 0;
	}
}